

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_(rotating_file_sink<std::mutex> *this)

{
  size_t index;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  size_type *psVar5;
  size_t index_00;
  filename_t target;
  filename_t src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  filename_t local_f0;
  filename_t local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __stream = (FILE *)(this->file_helper_).fd_;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    (this->file_helper_).fd_ = (FILE *)0x0;
  }
  if (this->max_files_ != 0) {
    index_00 = this->max_files_;
    do {
      index = index_00 - 1;
      calc_filename(&local_d0,&this->base_filename_,index);
      bVar1 = details::os::path_exists(&local_d0);
      if (bVar1) {
        calc_filename(&local_f0,&this->base_filename_,index_00);
        details::os::remove((char *)&local_f0);
        iVar2 = details::os::rename((char *)&local_d0,(char *)&local_f0);
        if (iVar2 != 0) {
          details::os::sleep_for_millis(100);
          details::os::remove((char *)&local_f0);
          iVar2 = details::os::rename((char *)&local_d0,(char *)&local_f0);
          if (iVar2 != 0) {
            details::file_helper::reopen(&this->file_helper_,true);
            this->current_size_ = 0;
            details::os::filename_to_str(&local_90,&local_d0);
            std::operator+(&local_70,"rotating_file_sink: failed renaming ",&local_90);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_110._M_dataplus._M_p = (pointer)*plVar3;
            psVar5 = (size_type *)(plVar3 + 2);
            if ((size_type *)local_110._M_dataplus._M_p == psVar5) {
              local_110.field_2._M_allocated_capacity = *psVar5;
              local_110.field_2._8_8_ = plVar3[3];
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            }
            else {
              local_110.field_2._M_allocated_capacity = *psVar5;
            }
            local_110._M_string_length = plVar3[1];
            *plVar3 = (long)psVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            details::os::filename_to_str(&local_b0,&local_f0);
            std::operator+(&local_50,&local_110,&local_b0);
            piVar4 = __errno_location();
            throw_spdlog_ex(&local_50,*piVar4);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      index_00 = index;
    } while (index != 0);
  }
  details::file_helper::reopen(&this->file_helper_,true);
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_()
{
    using details::os::filename_to_str;
    using details::os::path_exists;
    file_helper_.close();
    for (auto i = max_files_; i > 0; --i)
    {
        filename_t src = calc_filename(base_filename_, i - 1);
        if (!path_exists(src))
        {
            continue;
        }
        filename_t target = calc_filename(base_filename_, i);

        if (!rename_file_(src, target))
        {
            // if failed try again after a small delay.
            // this is a workaround to a windows issue, where very high rotation
            // rates can cause the rename to fail with permission denied (because of antivirus?).
            details::os::sleep_for_millis(100);
            if (!rename_file_(src, target))
            {
                file_helper_.reopen(true); // truncate the log file anyway to prevent it to grow beyond its limit!
                current_size_ = 0;
                throw_spdlog_ex("rotating_file_sink: failed renaming " + filename_to_str(src) + " to " + filename_to_str(target), errno);
            }
        }
    }
    file_helper_.reopen(true);
}